

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

float ImGui::GetColumnOffset(int column_index)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *g;
  float fVar2;
  
  pIVar1 = GImGui->CurrentWindow;
  if (column_index < 0) {
    column_index = (pIVar1->DC).ColumnsCurrent;
  }
  if ((GImGui->ActiveId == 0) || (GImGui->ActiveId != (pIVar1->DC).ColumnsSetId + column_index)) {
    if ((pIVar1->DC).ColumnsData.Size <= column_index) {
      __assert_fail("column_index < window->DC.ColumnsData.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0x2468,"float ImGui::GetColumnOffset(int)");
    }
    fVar2 = (pIVar1->DC).ColumnsMinX;
    fVar2 = (float)(int)(((pIVar1->DC).ColumnsMaxX - fVar2) *
                         (pIVar1->DC).ColumnsData.Data[column_index].OffsetNorm + fVar2);
  }
  else {
    fVar2 = GetDraggedColumnOffset(column_index);
  }
  return fVar2;
}

Assistant:

float ImGui::GetColumnOffset(int column_index)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindowRead();
    if (column_index < 0)
        column_index = window->DC.ColumnsCurrent;

    if (g.ActiveId)
    {
        const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(column_index);
        if (g.ActiveId == column_id)
            return GetDraggedColumnOffset(column_index);
    }

    IM_ASSERT(column_index < window->DC.ColumnsData.Size);
    const float t = window->DC.ColumnsData[column_index].OffsetNorm;
    const float x_offset = window->DC.ColumnsMinX + t * (window->DC.ColumnsMaxX - window->DC.ColumnsMinX);
    return (float)(int)x_offset;
}